

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CNegativeXFB<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  long lVar4;
  bool extraout_DL;
  char *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zarro;
  GLchar *varyings [1];
  DILogger local_328;
  DIResult result;
  
  this_01 = "GL_EXT_geometry_shader";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_EXT_geometry_shader");
  glcts::(anonymous_namespace)::test_api::ES3::glslVer_abi_cxx11_
            ((string *)&result,(ES3 *)this_01,extraout_DL);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "\nout highp vec4 dataOut;\nin vec4 i_vertex;\nvoid main() {\n  dataOut = i_vertex;\n  gl_Position = i_vertex;\n}"
                );
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,fixed_sample_locations_values + 1,(allocator<char> *)varyings);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)&local_328,(string *)&result,
                     (string *)&zarro,false);
  this->_program = GVar2;
  std::__cxx11::string::~string((string *)&zarro);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_328);
  varyings[0] = "dataOut";
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->_program,1,varyings,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar4 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar4 == 0) {
    result.status_ = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    result.logger_.null_log_ = false;
    result.logger_._1_3_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&zarro,0x1000,(value_type_conflict4 *)&result,(allocator_type *)&local_328);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,0x1000,
               zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8f3f,0x1000,
               zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,0x1000,
               zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    buffers = &this->_xfb;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8c8e,0x1000,
               zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*buffers);
    DIResult::DIResult(&result);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        DIResult::error(&local_328,&result);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_328,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_328);
      }
    }
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        DIResult::error(&local_328,&result);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_328,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_328);
      }
    }
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glGenTransformFeedbacks(this_00,1,&this->_xfo);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->_xfo);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*buffers);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glPauseTransformFeedback(this_00);
    glu::CallLogWrapper::glResumeTransformFeedback(this_00);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        DIResult::error(&local_328,&result);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_328,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_328);
      }
    }
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
    if (!bVar1) {
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x502) {
        DIResult::error(&local_328,&result);
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)&local_328,
                   (char (*) [70])
                   "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
        DILogger::~DILogger(&local_328);
      }
    }
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
    DILogger::~DILogger(&result.logger_);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&zarro.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return result.status_;
}

Assistant:

virtual long Run()
	{
		api::ES_Only();

		bool drawWithXFBAllowed = m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader");

		_program				 = CreateProgram(Vsh(), "", shaders::fshSimple<api>(), false);
		const GLchar* varyings[] = { "dataOut" };
		glTransformFeedbackVaryings(_program, 1, varyings, GL_INTERLEAVED_ATTRIBS);
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		std::vector<GLuint> zarro(4096, 0);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);
		glBufferData(GL_ARRAY_BUFFER, 4096, &zarro[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_xfb);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, _xfb);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _xfb);

		DIResult result;

		//Without XFO
		glBeginTransformFeedback(GL_POINTS);

		glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glDrawArraysIndirect(GL_POINTS, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glEndTransformFeedback();

		//With XFO
		glGenTransformFeedbacks(1, &_xfo);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, _xfo);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, _xfb);
		glBeginTransformFeedback(GL_POINTS);
		glPauseTransformFeedback();
		glResumeTransformFeedback();

		glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glDrawArraysIndirect(GL_POINTS, NULL);
		if (!drawWithXFBAllowed && glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}
		glEndTransformFeedback();

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		return result.code();
	}